

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart.c
# Opt level: O1

void read_callback(void *context,cio_epoll_error error)

{
  long lVar1;
  ssize_t sVar2;
  int *piVar3;
  code *UNRECOVERED_JUMPTABLE;
  int iVar4;
  undefined8 uVar5;
  
  lVar1 = *(long *)((long)context + 0x28);
  if (error != CIO_EPOLL_SUCCESS) {
    read_callback_cold_1();
    return;
  }
  sVar2 = read(*(int *)((long)context + 0x1070),*(void **)(lVar1 + 0x10),
               *(long *)(lVar1 + 8) - (long)*(void **)(lVar1 + 0x10));
  if (sVar2 == 0) {
    iVar4 = 1;
  }
  else {
    if (sVar2 == -1) {
      piVar3 = __errno_location();
      if (*piVar3 == 0xb) {
        return;
      }
      UNRECOVERED_JUMPTABLE = *(code **)((long)context + 0x18);
      uVar5 = *(undefined8 *)((long)context + 0x20);
      iVar4 = -*piVar3;
      goto LAB_00103014;
    }
    *(long *)(lVar1 + 0x10) = *(long *)(lVar1 + 0x10) + sVar2;
    iVar4 = 0;
  }
  UNRECOVERED_JUMPTABLE = *(code **)((long)context + 0x18);
  uVar5 = *(undefined8 *)((long)context + 0x20);
LAB_00103014:
  (*UNRECOVERED_JUMPTABLE)(context,uVar5,iVar4,lVar1);
  return;
}

Assistant:

static void read_callback(void *context, enum cio_epoll_error error)
{
	struct cio_io_stream *stream = context;
	struct cio_read_buffer *read_buffer = stream->read_buffer;
	struct cio_uart *uart = cio_container_of(stream, struct cio_uart, stream);

	enum cio_error err = CIO_SUCCESS;

	if (cio_unlikely(error != CIO_EPOLL_SUCCESS)) {
		err = cio_linux_get_socket_error(uart->impl.ev.fd);
		stream->read_handler(stream, stream->read_handler_context, err, read_buffer);
		return;
	}

	ssize_t ret = read(uart->impl.ev.fd, read_buffer->add_ptr, cio_read_buffer_space_available(read_buffer));
	if (ret == -1) {
		if (cio_unlikely(errno != EAGAIN)) {
			stream->read_handler(stream, stream->read_handler_context, (enum cio_error)(-errno), read_buffer);
		}
	} else {
		if (ret == 0) {
			err = CIO_EOF;
		} else {
			read_buffer->add_ptr += (size_t)ret;
		}

		stream->read_handler(stream, stream->read_handler_context, err, read_buffer);
	}
}